

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::CommandMigrate
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  CommissionerSafe *local_98;
  _Any_data local_90;
  code *local_80;
  undefined8 uStack_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_98 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_90,aHandler);
  local_70 = local_60;
  pcVar1 = (aDstAddr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + aDstAddr->_M_string_length);
  local_50 = local_40;
  pcVar1 = (aDstNetworkName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + aDstNetworkName->_M_string_length);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x68);
  *(CommissionerSafe **)p_Var2 = local_98;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_78;
  if (local_80 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_90._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_90._8_8_;
    *(code **)(p_Var2 + 0x18) = local_80;
    local_80 = (code *)0x0;
    uStack_78 = 0;
  }
  *(_func_void **)(p_Var2 + 0x28) = p_Var2 + 0x38;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x28),local_70,local_70 + local_68);
  *(_func_void **)(p_Var2 + 0x48) = p_Var2 + 0x58;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x48),local_50,local_50 + local_48);
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:429:22)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:429:22)>
             ::_M_manager;
  local_b8._M_unused._M_function_pointer = p_Var2;
  PushAsyncRequest(this,(AsyncRequest *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    PushAsyncRequest([=]() { mImpl->CommandMigrate(aHandler, aDstAddr, aDstNetworkName); });
}